

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O3

int mahjong::knitted_straight_shanten
              (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *useful_table)

{
  int iVar1;
  long lVar2;
  int iVar3;
  useful_table_t *in_R8;
  intptr_t i;
  long lVar4;
  int i_1;
  useful_table_t temp_table;
  tile_table_t cnt_table;
  byte local_118 [80];
  uint16_t local_c8 [76];
  
  iVar3 = 0x7fffffff;
  if ((standing_tiles != (tile_t *)0x0) && ((standing_cnt == 0xd || (standing_cnt == 10)))) {
    lVar4 = 0;
    memset(local_c8,0,0x90);
    do {
      local_c8[standing_tiles[lVar4]] = local_c8[standing_tiles[lVar4]] + 1;
      lVar4 = lVar4 + 1;
    } while (standing_cnt != lVar4);
    if (useful_table == (useful_table_t *)0x0) {
      iVar3 = 0x7fffffff;
      lVar4 = 0;
      do {
        iVar1 = basic_form_shanten_specified
                          ((tile_table_t *)local_c8,&standard_knitted_straight + lVar4,
                           (0xd - (int)standing_cnt) / 3,0,in_R8);
        if (iVar1 < iVar3) {
          iVar3 = iVar1;
        }
        lVar4 = lVar4 + 9;
      } while (lVar4 != 0x36);
    }
    else {
      *(bool *)((long)useful_table + 0x30) = false;
      *(bool *)((long)useful_table + 0x31) = false;
      *(bool *)((long)useful_table + 0x32) = false;
      *(bool *)((long)useful_table + 0x33) = false;
      *(bool *)((long)useful_table + 0x34) = false;
      *(bool *)((long)useful_table + 0x35) = false;
      *(bool *)((long)useful_table + 0x36) = false;
      *(bool *)((long)useful_table + 0x37) = false;
      *(bool *)((long)useful_table + 0x38) = false;
      *(bool *)((long)useful_table + 0x39) = false;
      *(bool *)((long)useful_table + 0x3a) = false;
      *(bool *)((long)useful_table + 0x3b) = false;
      *(bool *)((long)useful_table + 0x3c) = false;
      *(bool *)((long)useful_table + 0x3d) = false;
      *(bool *)((long)useful_table + 0x3e) = false;
      *(bool *)((long)useful_table + 0x3f) = false;
      *(bool *)((long)useful_table + 0x20) = false;
      *(bool *)((long)useful_table + 0x21) = false;
      *(bool *)((long)useful_table + 0x22) = false;
      *(bool *)((long)useful_table + 0x23) = false;
      *(bool *)((long)useful_table + 0x24) = false;
      *(bool *)((long)useful_table + 0x25) = false;
      *(bool *)((long)useful_table + 0x26) = false;
      *(bool *)((long)useful_table + 0x27) = false;
      *(bool *)((long)useful_table + 0x28) = false;
      *(bool *)((long)useful_table + 0x29) = false;
      *(bool *)((long)useful_table + 0x2a) = false;
      *(bool *)((long)useful_table + 0x2b) = false;
      *(bool *)((long)useful_table + 0x2c) = false;
      *(bool *)((long)useful_table + 0x2d) = false;
      *(bool *)((long)useful_table + 0x2e) = false;
      *(bool *)((long)useful_table + 0x2f) = false;
      *(bool *)((long)useful_table + 0x10) = false;
      *(bool *)((long)useful_table + 0x11) = false;
      *(bool *)((long)useful_table + 0x12) = false;
      *(bool *)((long)useful_table + 0x13) = false;
      *(bool *)((long)useful_table + 0x14) = false;
      *(bool *)((long)useful_table + 0x15) = false;
      *(bool *)((long)useful_table + 0x16) = false;
      *(bool *)((long)useful_table + 0x17) = false;
      *(bool *)((long)useful_table + 0x18) = false;
      *(bool *)((long)useful_table + 0x19) = false;
      *(bool *)((long)useful_table + 0x1a) = false;
      *(bool *)((long)useful_table + 0x1b) = false;
      *(bool *)((long)useful_table + 0x1c) = false;
      *(bool *)((long)useful_table + 0x1d) = false;
      *(bool *)((long)useful_table + 0x1e) = false;
      *(bool *)((long)useful_table + 0x1f) = false;
      *(bool *)((long)useful_table + 0) = false;
      *(bool *)((long)useful_table + 1) = false;
      *(bool *)((long)useful_table + 2) = false;
      *(bool *)((long)useful_table + 3) = false;
      *(bool *)((long)useful_table + 4) = false;
      *(bool *)((long)useful_table + 5) = false;
      *(bool *)((long)useful_table + 6) = false;
      *(bool *)((long)useful_table + 7) = false;
      *(bool *)((long)useful_table + 8) = false;
      *(bool *)((long)useful_table + 9) = false;
      *(bool *)((long)useful_table + 10) = false;
      *(bool *)((long)useful_table + 0xb) = false;
      *(bool *)((long)useful_table + 0xc) = false;
      *(bool *)((long)useful_table + 0xd) = false;
      *(bool *)((long)useful_table + 0xe) = false;
      *(bool *)((long)useful_table + 0xf) = false;
      *(bool *)((long)useful_table + 0x40) = false;
      *(bool *)((long)useful_table + 0x41) = false;
      *(bool *)((long)useful_table + 0x42) = false;
      *(bool *)((long)useful_table + 0x43) = false;
      *(bool *)((long)useful_table + 0x44) = false;
      *(bool *)((long)useful_table + 0x45) = false;
      *(bool *)((long)useful_table + 0x46) = false;
      *(bool *)((long)useful_table + 0x47) = false;
      iVar3 = 0x7fffffff;
      lVar4 = 0;
      do {
        iVar1 = basic_form_shanten_specified
                          ((tile_table_t *)local_c8,&standard_knitted_straight + lVar4 * 9,
                           (0xd - (int)standing_cnt) / 3,(intptr_t)local_118,in_R8);
        if (iVar1 < iVar3) {
          memcpy(useful_table,local_118,0x48);
          iVar3 = iVar1;
        }
        else if (iVar1 == iVar3) {
          lVar2 = 0;
          do {
            (*useful_table)[lVar2] = (bool)((*useful_table)[lVar2] | local_118[lVar2]);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0x48);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
    }
  }
  return iVar3;
}

Assistant:

int knitted_straight_shanten(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *useful_table) {
    if (standing_tiles == nullptr || (standing_cnt != 13 && standing_cnt != 10)) {
        return std::numeric_limits<int>::max();
    }

    // 打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    int ret = std::numeric_limits<int>::max();

    // 需要获取有效牌时，计算上听数的同时就获取有效牌了
    if (useful_table != nullptr) {
        memset(*useful_table, 0, sizeof(*useful_table));

        useful_table_t temp_table;

        // 6种组合龙分别计算
        for (int i = 0; i < 6; ++i) {
            int fixed_cnt = (13 - static_cast<int>(standing_cnt)) / 3;
            int st = basic_form_shanten_specified(cnt_table, standard_knitted_straight[i], 9, fixed_cnt, &temp_table);
            if (st < ret) {  // 上听数小的，直接覆盖数据
                ret = st;
                memcpy(*useful_table, temp_table, sizeof(*useful_table));  // 直接覆盖原来的有效牌数据
            }
            else if (st == ret) {  // 两种不同组合龙上听数如果相等的话，直接合并有效牌
                std::transform(std::begin(*useful_table), std::end(*useful_table), std::begin(temp_table),
                    std::begin(*useful_table), [](bool u, bool t) { return u || t; });
            }
        }
    }
    else {
        // 6种组合龙分别计算
        for (int i = 0; i < 6; ++i) {
            int fixed_cnt = (13 - static_cast<int>(standing_cnt)) / 3;
            int st = basic_form_shanten_specified(cnt_table, standard_knitted_straight[i], 9, fixed_cnt, nullptr);
            if (st < ret) {
                ret = st;
            }
        }
    }

    return ret;
}